

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

int __thiscall
cmGlobalGenerator::Build
          (cmGlobalGenerator *this,int jobs,string *param_2,string *bindir,string *projectName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets,string *output,string *makeCommandCSTR,string *config,
          cmBuildOptions *buildOptions,bool verbose,cmDuration timeout,OutputOption outputflag,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *nativeOptions)

{
  cmake *this_00;
  bool bVar1;
  bool bVar2;
  char *__s;
  long lVar3;
  int iVar4;
  GeneratedMakeCommand *this_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int retVal;
  allocator_type local_162;
  allocator<char> local_161;
  string makeCommandStr;
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  cleanCommand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  cmDuration local_f8;
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  makeCommand;
  string outputBuffer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  string realConfig;
  cmWorkingDirectory workdir;
  
  bVar2 = cmSystemTools::s_RunCommandHideConsole;
  local_f8.__r = timeout.__r;
  cmWorkingDirectory::cmWorkingDirectory(&workdir,bindir);
  std::__cxx11::string::append((char *)output);
  std::__cxx11::string::append((string *)output);
  std::__cxx11::string::append((char *)output);
  if (workdir.ResultCode != 0) {
    realConfig._M_dataplus._M_p = (pointer)0x1c;
    realConfig._M_string_length = (size_type)anon_var_dwarf_117d371;
    cmSystemTools::s_RunCommandHideConsole = bVar2;
    __s = strerror(workdir.ResultCode);
    outputBuffer._M_dataplus._M_p = (pointer)strlen(__s);
    outputBuffer._M_string_length = (size_type)__s;
    cmStrCat<>(&makeCommandStr,(cmAlphaNum *)&realConfig,(cmAlphaNum *)&outputBuffer);
    cmSystemTools::Error(&makeCommandStr);
    std::__cxx11::string::append((string *)output);
    std::__cxx11::string::append((char *)output);
    std::__cxx11::string::~string((string *)&makeCommandStr);
    iVar4 = 1;
    goto LAB_00369f21;
  }
  std::__cxx11::string::string((string *)&realConfig,(string *)config);
  if (realConfig._M_string_length == 0) {
    (*this->_vptr_cmGlobalGenerator[0x25])(&outputBuffer);
    std::__cxx11::string::operator=((string *)&realConfig,(string *)&outputBuffer);
    std::__cxx11::string::~string((string *)&outputBuffer);
  }
  retVal = 0;
  outputBuffer._M_dataplus._M_p = (pointer)&outputBuffer.field_2;
  outputBuffer._M_string_length = 0;
  cmSystemTools::s_RunCommandHideConsole = true;
  outputBuffer.field_2._M_local_buf[0] = '\0';
  (*this->_vptr_cmGlobalGenerator[0x13])
            (&makeCommand,this,makeCommandCSTR,projectName,bindir,targets,&realConfig,
             (ulong)(uint)jobs,(ulong)verbose,buildOptions,nativeOptions);
  if (outputflag == OUTPUT_PASSTHROUGH) {
    outputflag = makeCommand.
                 super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].super_GeneratedMakeCommand.
                 RequiresOutputForward ^ OUTPUT_PASSTHROUGH;
  }
  if (buildOptions->Clean == true) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&makeCommandStr,"clean",&local_161)
    ;
    __l._M_len = 1;
    __l._M_array = &makeCommandStr;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_118,__l,&local_162);
    local_a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (*this->_vptr_cmGlobalGenerator[0x13])
              (&cleanCommand,this,makeCommandCSTR,projectName,bindir,&local_118,&realConfig,
               (ulong)(uint)jobs,(ulong)verbose,buildOptions,&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_118);
    std::__cxx11::string::~string((string *)&makeCommandStr);
    std::__cxx11::string::append((char *)output);
    detail::GeneratedMakeCommand::Printable_abi_cxx11_
              (&makeCommandStr,
               &(cleanCommand.
                 super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                 ._M_impl.super__Vector_impl_data._M_start)->super_GeneratedMakeCommand);
    std::__cxx11::string::append((string *)output);
    std::__cxx11::string::~string((string *)&makeCommandStr);
    std::__cxx11::string::append((char *)output);
    if ((long)cleanCommand.
              super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)cleanCommand.
              super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x20) {
      bVar1 = cmSystemTools::RunSingleCommand
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)cleanCommand.
                            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                            ._M_impl.super__Vector_impl_data._M_start,&outputBuffer,&outputBuffer,
                         &retVal,(char *)0x0,outputflag,local_f8,Auto);
      if (bVar1) {
        std::__cxx11::string::append((string *)output);
        std::
        vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
        ::~vector(&cleanCommand);
        goto LAB_00369c16;
      }
      cmSystemTools::s_RunCommandHideConsole = bVar2;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&makeCommandStr,"Generator: execution of make clean failed.",
                 (allocator<char> *)&local_118);
      cmSystemTools::Error(&makeCommandStr);
      std::__cxx11::string::~string((string *)&makeCommandStr);
      std::__cxx11::string::append((string *)output);
      std::__cxx11::string::append((char *)output);
    }
    else {
      this_00 = this->CMakeInstance;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&makeCommandStr,
                 "The generator did not produce exactly one command for the \'clean\' target",
                 (allocator<char> *)&local_a8);
      local_118._M_dataplus._M_p = (pointer)0x0;
      local_118._M_string_length = 0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_118);
      cmake::IssueMessage(this_00,INTERNAL_ERROR,&makeCommandStr,(cmListFileBacktrace *)&local_118);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_118._M_string_length);
      std::__cxx11::string::~string((string *)&makeCommandStr);
    }
    std::
    vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
    ::~vector(&cleanCommand);
    iVar4 = 1;
  }
  else {
LAB_00369c16:
    makeCommandStr._M_dataplus._M_p = (pointer)&makeCommandStr.field_2;
    makeCommandStr._M_string_length = 0;
    makeCommandStr.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)output);
    retVal = 0;
    this_01 = &(makeCommand.
                super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
                ._M_impl.super__Vector_impl_data._M_start)->super_GeneratedMakeCommand;
    while ((this_01 !=
            &(makeCommand.
              super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
              ._M_impl.super__Vector_impl_data._M_finish)->super_GeneratedMakeCommand &&
           (retVal == 0))) {
      detail::GeneratedMakeCommand::Printable_abi_cxx11_((string *)&cleanCommand,this_01);
      std::__cxx11::string::operator=((string *)&makeCommandStr,(string *)&cleanCommand);
      std::__cxx11::string::~string((string *)&cleanCommand);
      if (this_01 !=
          &(makeCommand.
            super__Vector_base<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
            ._M_impl.super__Vector_impl_data._M_finish)->super_GeneratedMakeCommand) {
        std::__cxx11::string::append((char *)&makeCommandStr);
      }
      std::__cxx11::string::append((string *)output);
      bVar1 = cmSystemTools::RunSingleCommand
                        (&this_01->PrimaryCommand,&outputBuffer,&outputBuffer,&retVal,(char *)0x0,
                         outputflag,local_f8,Auto);
      if (!bVar1) {
        cmSystemTools::s_RunCommandHideConsole = bVar2;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cleanCommand,"Generator: execution of make failed. Make command was: ",
                       &makeCommandStr);
        cmSystemTools::Error((string *)&cleanCommand);
        std::__cxx11::string::~string((string *)&cleanCommand);
        std::__cxx11::string::append((string *)output);
        std::operator+(&local_118,"\nGenerator: execution of make failed. Make command was: ",
                       &makeCommandStr);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cleanCommand,&local_118,"\n");
        std::__cxx11::string::append((string *)output);
        std::__cxx11::string::~string((string *)&cleanCommand);
        std::__cxx11::string::~string((string *)&local_118);
        goto LAB_00369e1e;
      }
      std::__cxx11::string::append((string *)output);
      this_01 = this_01 + 1;
    }
    std::__cxx11::string::append((char *)output);
    cmSystemTools::s_RunCommandHideConsole = bVar2;
    bVar2 = cmState::UseWatcomWMake
                      ((this->CMakeInstance->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    iVar4 = retVal;
    if ((bVar2 && retVal == 0) &&
       (lVar3 = std::__cxx11::string::find((char *)output,0x67884b), iVar4 = retVal, lVar3 != -1)) {
      retVal = 1;
LAB_00369e1e:
      iVar4 = 1;
    }
    std::__cxx11::string::~string((string *)&makeCommandStr);
  }
  std::
  vector<cmGlobalGenerator::GeneratedMakeCommand,_std::allocator<cmGlobalGenerator::GeneratedMakeCommand>_>
  ::~vector(&makeCommand);
  std::__cxx11::string::~string((string *)&outputBuffer);
  std::__cxx11::string::~string((string *)&realConfig);
LAB_00369f21:
  cmWorkingDirectory::~cmWorkingDirectory(&workdir);
  return iVar4;
}

Assistant:

int cmGlobalGenerator::Build(
  int jobs, const std::string& /*unused*/, const std::string& bindir,
  const std::string& projectName, const std::vector<std::string>& targets,
  std::string& output, const std::string& makeCommandCSTR,
  const std::string& config, const cmBuildOptions& buildOptions, bool verbose,
  cmDuration timeout, cmSystemTools::OutputOption outputflag,
  std::vector<std::string> const& nativeOptions)
{
  bool hideconsole = cmSystemTools::GetRunCommandHideConsole();

  /**
   * Run an executable command and put the stdout in output.
   */
  cmWorkingDirectory workdir(bindir);
  output += "Change Dir: ";
  output += bindir;
  output += "\n";
  if (workdir.Failed()) {
    cmSystemTools::SetRunCommandHideConsole(hideconsole);
    std::string err = cmStrCat("Failed to change directory: ",
                               std::strerror(workdir.GetLastResult()));
    cmSystemTools::Error(err);
    output += err;
    output += "\n";
    return 1;
  }
  std::string realConfig = config;
  if (realConfig.empty()) {
    realConfig = this->GetDefaultBuildConfig();
  }

  int retVal = 0;
  cmSystemTools::SetRunCommandHideConsole(true);
  std::string outputBuffer;
  std::string* outputPtr = &outputBuffer;

  std::vector<GeneratedMakeCommand> makeCommand = this->GenerateBuildCommand(
    makeCommandCSTR, projectName, bindir, targets, realConfig, jobs, verbose,
    buildOptions, nativeOptions);

  // Workaround to convince some commands to produce output.
  if (outputflag == cmSystemTools::OUTPUT_PASSTHROUGH &&
      makeCommand.back().RequiresOutputForward) {
    outputflag = cmSystemTools::OUTPUT_FORWARD;
  }

  // should we do a clean first?
  if (buildOptions.Clean) {
    std::vector<GeneratedMakeCommand> cleanCommand =
      this->GenerateBuildCommand(makeCommandCSTR, projectName, bindir,
                                 { "clean" }, realConfig, jobs, verbose,
                                 buildOptions);
    output += "\nRun Clean Command:";
    output += cleanCommand.front().Printable();
    output += "\n";
    if (cleanCommand.size() != 1) {
      this->GetCMakeInstance()->IssueMessage(MessageType::INTERNAL_ERROR,
                                             "The generator did not produce "
                                             "exactly one command for the "
                                             "'clean' target");
      return 1;
    }
    if (!cmSystemTools::RunSingleCommand(cleanCommand.front().PrimaryCommand,
                                         outputPtr, outputPtr, &retVal,
                                         nullptr, outputflag, timeout)) {
      cmSystemTools::SetRunCommandHideConsole(hideconsole);
      cmSystemTools::Error("Generator: execution of make clean failed.");
      output += *outputPtr;
      output += "\nGenerator: execution of make clean failed.\n";

      return 1;
    }
    output += *outputPtr;
  }

  // now build
  std::string makeCommandStr;
  output += "\nRun Build Command(s):";

  retVal = 0;
  for (auto command = makeCommand.begin();
       command != makeCommand.end() && retVal == 0; ++command) {
    makeCommandStr = command->Printable();
    if (command != makeCommand.end()) {
      makeCommandStr += " && ";
    }

    output += makeCommandStr;
    if (!cmSystemTools::RunSingleCommand(command->PrimaryCommand, outputPtr,
                                         outputPtr, &retVal, nullptr,
                                         outputflag, timeout)) {
      cmSystemTools::SetRunCommandHideConsole(hideconsole);
      cmSystemTools::Error(
        "Generator: execution of make failed. Make command was: " +
        makeCommandStr);
      output += *outputPtr;
      output += "\nGenerator: execution of make failed. Make command was: " +
        makeCommandStr + "\n";

      return 1;
    }
    output += *outputPtr;
  }
  output += "\n";
  cmSystemTools::SetRunCommandHideConsole(hideconsole);

  // The OpenWatcom tools do not return an error code when a link
  // library is not found!
  if (this->CMakeInstance->GetState()->UseWatcomWMake() && retVal == 0 &&
      output.find("W1008: cannot open") != std::string::npos) {
    retVal = 1;
  }

  return retVal;
}